

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void push_val(VARR_char *repr,mir_long val)

{
  htab_size_t *phVar1;
  VARR_htab_ind_t *pVVar2;
  VARR_HTAB_EL_reg_var_t *pVVar3;
  void *pvVar4;
  init_object_t *piVar5;
  long lVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  MIR_reg_t MVar11;
  undefined4 uVar12;
  htab_hash_t hVar13;
  long lVar14;
  c2m_ctx_t pcVar15;
  htab_ind_t *phVar16;
  HTAB_EL_reg_var_t *pHVar17;
  VARR_init_object_t *pVVar18;
  int iVar19;
  ulong in_RCX;
  uint *puVar20;
  MIR_reg_t extraout_EDX;
  size_t sVar21;
  htab_size_t hVar22;
  int iVar23;
  uint uVar24;
  size_t __size;
  uint *puVar25;
  uint uVar26;
  c2m_ctx_t pcVar27;
  c2m_ctx_t htab;
  reg_var_t *in_R8;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  VARR_htab_ind_t *pVVar32;
  VARR_HTAB_EL_reg_var_t *pVVar33;
  MIR_reg_t *pMVar34;
  reg_var_t rVar35;
  reg_var_t rVar36;
  reg_var_t rVar37;
  reg_var_t rVar38;
  reg_var_t rVar39;
  reg_var_t el;
  
  lVar30 = 10;
  htab = (c2m_ctx_t)repr;
  if (9 < val) {
    do {
      lVar30 = lVar30 * 10;
    } while (lVar30 <= val);
  }
  while( true ) {
    iVar19 = (int)in_RCX;
    pcVar27 = (c2m_ctx_t)0x6666666666666667;
    lVar6 = lVar30 / 10;
    lVar14 = val / lVar6;
    val = val % lVar6;
    pcVar15 = (c2m_ctx_t)repr->varr;
    if (pcVar15 == (c2m_ctx_t)0x0) break;
    sVar21 = repr->els_num;
    in_RCX = sVar21 + 1;
    if (repr->size < in_RCX) {
      __size = (in_RCX >> 1) + in_RCX;
      htab = pcVar15;
      pcVar15 = (c2m_ctx_t)realloc(pcVar15,__size);
      repr->varr = (char *)pcVar15;
      repr->size = __size;
      sVar21 = repr->els_num;
      in_RCX = sVar21 + 1;
    }
    uVar31 = lVar30 - 10;
    repr->els_num = in_RCX;
    *(char *)((long)pcVar15->env[0].__jmpbuf + (sVar21 - 0x10)) = (char)lVar14 + '0';
    lVar30 = lVar6;
    if (uVar31 < 10) {
      return;
    }
  }
  push_val_cold_1();
  pVVar2 = (VARR_htab_ind_t *)htab->env[0].__jmpbuf[5];
  if (pVVar2 == (VARR_htab_ind_t *)0x0) {
    HTAB_reg_var_t_do_cold_8();
    pcVar15 = htab;
LAB_001ab693:
    HTAB_reg_var_t_do_cold_7();
LAB_001ab698:
    HTAB_reg_var_t_do_cold_4();
LAB_001ab69d:
    HTAB_reg_var_t_do_cold_3();
LAB_001ab6a2:
    HTAB_reg_var_t_do_cold_5();
LAB_001ab6a7:
    HTAB_reg_var_t_do_cold_6();
  }
  else {
    pVVar3 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
    pcVar15 = htab;
    if (pVVar3 == (VARR_HTAB_EL_reg_var_t *)0x0) goto LAB_001ab693;
    pvVar4 = (void *)htab->env[0].__jmpbuf[0];
    uVar26 = (uint)pVVar2->els_num;
    uVar28 = uVar26;
    if ((iVar19 != 1) ||
       (hVar22 = (htab_size_t)pVVar3->els_num, *(htab_size_t *)&htab->options != hVar22)) {
LAB_001ab53f:
      rVar36.reg = extraout_EDX;
      rVar36.name = (char *)pcVar27;
      rVar36._12_4_ = 0;
      pcVar15 = pcVar27;
      hVar13 = (*(_func_htab_hash_t_reg_var_t_void_ptr *)htab->env[0].__jmpbuf[1])(rVar36,pvVar4);
      uVar26 = hVar13 + (hVar13 == 0);
      pVVar2 = (VARR_htab_ind_t *)htab->env[0].__jmpbuf[5];
      if (pVVar2 == (VARR_htab_ind_t *)0x0) goto LAB_001ab698;
      pVVar3 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
      if (pVVar3 != (VARR_HTAB_EL_reg_var_t *)0x0) {
        phVar16 = pVVar2->varr;
        pHVar17 = pVVar3->varr;
        puVar25 = (uint *)0x0;
        uVar24 = uVar26;
        uVar29 = uVar26;
        do {
          uVar29 = uVar29 & uVar28 - 1;
          puVar20 = phVar16 + uVar29;
          uVar31 = (ulong)*puVar20;
          if (uVar31 != 0xfffffffe) {
            if (*puVar20 == 0xffffffff) {
              if (iVar19 != 1) {
                return;
              }
              *(htab_size_t *)&htab->ctx = *(htab_size_t *)&htab->ctx + 1;
              uVar28 = *(uint *)&htab->options;
              if (puVar25 != (uint *)0x0) {
                puVar20 = puVar25;
              }
              pHVar17[uVar28].hash = uVar26;
              pHVar17[uVar28].el.name = (char *)pcVar27;
              pHVar17[uVar28].el.reg = extraout_EDX;
              uVar26 = *(uint *)&htab->options;
              *(uint *)&htab->options = uVar26 + 1;
              *puVar20 = uVar26;
              in_R8->name = (char *)pcVar27;
              in_R8->reg = extraout_EDX;
              return;
            }
            puVar20 = puVar25;
            if ((pHVar17[uVar31].hash == uVar26) &&
               (uVar9 = pHVar17[uVar31].el.name, uVar10 = pHVar17[uVar31].el.reg,
               rVar37.reg = uVar10, rVar37.name = (char *)uVar9, rVar37._12_4_ = 0,
               rVar39.reg = extraout_EDX, rVar39.name = (char *)pcVar27, rVar39._12_4_ = 0,
               iVar23 = (*(_func_int_reg_var_t_reg_var_t_void_ptr *)htab->env[0].__jmpbuf[2])
                                  (rVar37,rVar39,pvVar4), iVar23 != 0)) {
              MVar11 = pHVar17[uVar31].el.reg;
              uVar12 = *(undefined4 *)&pHVar17[uVar31].el.field_0xc;
              in_R8->name = pHVar17[uVar31].el.name;
              in_R8->reg = MVar11;
              *(undefined4 *)&in_R8->field_0xc = uVar12;
              return;
            }
          }
          phVar1 = (htab_size_t *)((long)&htab->options + 4);
          *phVar1 = *phVar1 + 1;
          uVar24 = uVar24 >> 0xb;
          uVar29 = uVar24 + 1 + uVar29 * 5;
          puVar25 = puVar20;
        } while( true );
      }
      goto LAB_001ab69d;
    }
    pcVar15 = (c2m_ctx_t)pVVar2->varr;
    if (pcVar15 == (c2m_ctx_t)0x0) goto LAB_001ab6a7;
    uVar28 = uVar26 * 2;
    uVar31 = (ulong)uVar28;
    if (pVVar2->size == uVar31) {
      pVVar2->els_num = uVar31;
      pVVar32 = pVVar2;
LAB_001ab44c:
      if (uVar28 != 0) {
        pcVar15 = (c2m_ctx_t)pVVar32->varr;
        memset(pcVar15,0xff,(ulong)(uVar26 & 0x7fffffff) << 3);
      }
      pVVar3 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
      if ((pVVar3 != (VARR_HTAB_EL_reg_var_t *)0x0) &&
         (pcVar15 = (c2m_ctx_t)pVVar3->varr, pcVar15 != (c2m_ctx_t)0x0)) {
        uVar31 = (ulong)(hVar22 * 2);
        if (pVVar3->size == uVar31) {
          pVVar3->els_num = uVar31;
          pVVar33 = pVVar3;
        }
        else {
          pHVar17 = (HTAB_EL_reg_var_t *)realloc(pcVar15,uVar31 * 0x18);
          pVVar3->varr = pHVar17;
          pVVar33 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
          pVVar3->size = uVar31;
          pVVar3->els_num = uVar31;
          if (pVVar33 == (VARR_HTAB_EL_reg_var_t *)0x0) goto LAB_001ab6b1;
        }
        pHVar17 = pVVar33->varr;
        uVar26 = *(htab_size_t *)((long)&htab->ctx + 4);
        uVar29 = *(uint *)&htab->options;
        *(htab_size_t *)&htab->ctx = 0;
        *(htab_size_t *)&htab->options = 0;
        *(htab_size_t *)((long)&htab->ctx + 4) = 0;
        if (uVar26 < uVar29) {
          iVar23 = uVar29 - uVar26;
          pMVar34 = &pHVar17[uVar26].el.reg;
          do {
            if (pMVar34[-4] != 0) {
              el.reg = *pMVar34;
              el.name = ((reg_var_t *)(pMVar34 + -2))->name;
              el._12_4_ = 0;
              HTAB_reg_var_t_do((HTAB_reg_var_t *)htab,el,HTAB_INSERT,in_R8);
              uVar7 = in_R8->name;
              uVar8 = in_R8->reg;
              rVar35.reg = uVar8;
              rVar35.name = (char *)uVar7;
              rVar35._12_4_ = 0;
              rVar38.reg = *pMVar34;
              rVar38.name = ((reg_var_t *)(pMVar34 + -2))->name;
              rVar38._12_4_ = 0;
              (*(_func_int_reg_var_t_reg_var_t_void_ptr *)htab->env[0].__jmpbuf[2])
                        (rVar35,rVar38,pvVar4);
            }
            pMVar34 = pMVar34 + 6;
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
        }
        goto LAB_001ab53f;
      }
      goto LAB_001ab6a2;
    }
    phVar16 = (htab_ind_t *)realloc(pcVar15,uVar31 * 4);
    pVVar2->varr = phVar16;
    pVVar32 = (VARR_htab_ind_t *)htab->env[0].__jmpbuf[5];
    pVVar2->size = uVar31;
    pVVar2->els_num = uVar31;
    if (pVVar32 != (VARR_htab_ind_t *)0x0) goto LAB_001ab44c;
  }
  HTAB_reg_var_t_do_cold_1();
LAB_001ab6b1:
  HTAB_reg_var_t_do_cold_2();
  pVVar18 = pcVar15->init_object_path;
  if (pVVar18 != (VARR_init_object_t *)0x0) {
    uVar31 = 0xffffffffffffffff;
    lVar30 = 0x10;
    do {
      uVar31 = uVar31 + 1;
      if (pVVar18->els_num <= uVar31) {
        return;
      }
      piVar5 = pVVar18->varr;
      if (piVar5 == (init_object_t *)0x0) {
        get_object_path_offset_cold_1();
LAB_001ab7a3:
        __assert_fail("init_object.u.curr_member->code == N_MEMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2cab,"mir_size_t get_object_path_offset(c2m_ctx_t)");
      }
      lVar6 = *(long *)((long)piVar5 + lVar30 + -0x10);
      iVar19 = *(int *)(lVar6 + 0x18);
      if (iVar19 - 4U < 2) {
        if (**(int **)((long)&piVar5->container_type + lVar30) != 0x6c) goto LAB_001ab7a3;
      }
      else {
        if (iVar19 != 6) {
          __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2caa,"mir_size_t get_object_path_offset(c2m_ctx_t)");
        }
        raw_type_size(pcVar15,*(type **)(*(long *)(lVar6 + 0x30) + 8));
        pVVar18 = pcVar15->init_object_path;
      }
      lVar30 = lVar30 + 0x18;
    } while (pVVar18 != (VARR_init_object_t *)0x0);
  }
  get_object_path_offset_cold_2();
  return;
}

Assistant:

static void push_val (VARR (char) * repr, mir_long val) {
  mir_long bound;

  for (bound = 10; val >= bound;) bound *= 10;
  while (bound != 1) {
    bound /= 10;
    VARR_PUSH (char, repr, '0' + val / bound);
    val %= bound;
  }
}